

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

void __thiscall MemoryLeakDetector::invalidateMemory(MemoryLeakDetector *this,char *memory)

{
  MemoryLeakDetectorNode *pMVar1;
  
  for (pMVar1 = (this->memoryTable_).table_
                [(uint)((int)memory + (int)((ulong)memory / 0x49) * -0x49)].head_;
      pMVar1 != (MemoryLeakDetectorNode *)0x0; pMVar1 = *(MemoryLeakDetectorNode **)(pMVar1 + 0x38))
  {
    if (*(char **)(pMVar1 + 0x10) == memory) goto LAB_0013b77d;
  }
  pMVar1 = (MemoryLeakDetectorNode *)0x0;
LAB_0013b77d:
  if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
    (*PlatformSpecificMemset)(memory,0xcd,*(size_t *)pMVar1);
    return;
  }
  return;
}

Assistant:

void MemoryLeakDetector::invalidateMemory(char* memory)
{
#ifndef CPPUTEST_DISABLE_HEAP_POISON
  MemoryLeakDetectorNode* node = memoryTable_.retrieveNode(memory);
  if (node)
    PlatformSpecificMemset(memory, 0xCD, node->size_);
#endif
}